

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void __thiscall CoreML::Model::Model(Model *this,string *description)

{
  element_type *this_00;
  ModelDescription *this_01;
  Metadata *this_02;
  Arena *pAVar1;
  Metadata *metadata;
  string *description_local;
  Model *this_local;
  
  Model(this);
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_spec);
  this_01 = Specification::Model::mutable_description(this_00);
  this_02 = Specification::ModelDescription::mutable_metadata(this_01);
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this_02->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set(&this_02->shortdescription_,description,pAVar1);
  return;
}

Assistant:

Model::Model(const std::string& description)
    : Model::Model() {
        Specification::Metadata* metadata = m_spec->mutable_description()->mutable_metadata();
        metadata->set_shortdescription(description);
    }